

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O1

uint32_t FAudioCreateReverb9(FAPO **ppApo,uint32_t Flags)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  undefined4 in_register_00000034;
  FAudioFXReverbParameters9 fxdefault;
  
  fxdefault._32_8_ = 0;
  fxdefault._40_5_ = 0x3f80000000;
  fxdefault._16_8_ = 0x9c40000408040808;
  fxdefault._24_8_ = 0x45;
  fxdefault.WetDryMix = 100.0;
  fxdefault.ReflectionsDelay = 5;
  fxdefault.ReverbDelay = '\x05';
  fxdefault.RearDelay = '\x05';
  fxdefault.SideDelay = '\x05';
  fxdefault.PositionLeft = '\x06';
  fxdefault.PositionRight = '\x06';
  fxdefault.PositionMatrixLeft = '\x1b';
  fxdefault.PositionMatrixRight = '\x1b';
  fxdefault.EarlyDiffusion = '\b';
  fxdefault.Density._0_3_ = 0xc80000;
  fxdefault._48_5_ = 0x42c8000042;
  fapo = (FAPOBase *)SDL_malloc(0x18d0,CONCAT44(in_register_00000034,Flags));
  pParameterBlocks = (uint8_t *)SDL_malloc(0x9f);
  *(undefined1 *)((long)&fapo[1].base.Release + 4) = 9;
  SDL_memcpy(pParameterBlocks,&fxdefault,0x35);
  SDL_memcpy(pParameterBlocks + 0x35,&fxdefault,0x35);
  SDL_memcpy(pParameterBlocks + 0x6a,&fxdefault,0x35);
  SDL_memcpy(&ReverbProperties,&FAudioFX_CLSID_AudioReverb,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&ReverbProperties,pParameterBlocks,0x35,'\0',SDL_malloc,SDL_free,SDL_realloc);
  fapo[1].base.AddRef = (AddRefFunc)0x0;
  SDL_memset(&fapo[1].base.GetRegistrationProperties,0,0x17e0);
  (fapo->base).LockForProcess = FAudioFXReverb_LockForProcess;
  (fapo->base).IsInputFormatSupported = FAudioFXReverb_IsInputFormatSupported;
  (fapo->base).IsOutputFormatSupported = FAudioFXReverb_IsOutputFormatSupported;
  (fapo->base).Initialize = FAudioFXReverb_Initialize;
  (fapo->base).Reset = FAudioFXReverb_Reset;
  (fapo->base).Process = FAudioFXReverb_Process;
  fapo->Destructor = FAudioFXReverb_Free;
  *ppApo = (FAPO *)fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateReverb9(FAPO** ppApo, uint32_t Flags)
{
	return FAudioCreateReverb9WithCustomAllocatorEXT(
		ppApo,
		Flags,
		FAudio_malloc,
		FAudio_free,
		FAudio_realloc
	);
}